

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serverbrowser_fav.cpp
# Opt level: O0

CFavoriteServer * __thiscall
CServerBrowserFavorites::FindFavoriteByAddr(CServerBrowserFavorites *this,NETADDR *Addr,int *Index)

{
  int iVar1;
  int *in_RDX;
  NETADDR *in_RDI;
  int i;
  int in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd8;
  int iVar2;
  
  iVar2 = 0;
  while( true ) {
    if (*(int *)(in_RDI[0x7d5].ip + 4) <= iVar2) {
      return (CFavoriteServer *)0x0;
    }
    if ((2 < *(int *)((long)in_RDI + (long)iVar2 * 0xbc + 0xb8)) &&
       (iVar1 = net_addr_comp((NETADDR *)CONCAT44(iVar2,in_stack_ffffffffffffffd8),in_RDI,
                              in_stack_ffffffffffffffcc), iVar1 == 0)) break;
    iVar2 = iVar2 + 1;
  }
  if (in_RDX != (int *)0x0) {
    *in_RDX = iVar2;
  }
  return (CFavoriteServer *)((long)in_RDI + (long)iVar2 * 0xbc);
}

Assistant:

CServerBrowserFavorites::CFavoriteServer *CServerBrowserFavorites::FindFavoriteByAddr(const NETADDR &Addr, int *Index)
{
	for(int i = 0; i < m_NumFavoriteServers; i++)
	{
		if(m_aFavoriteServers[i].m_State >= FAVSTATE_ADDR && net_addr_comp(&Addr, &m_aFavoriteServers[i].m_Addr, true) == 0)
		{
			if(Index)
				*Index = i;
			return &m_aFavoriteServers[i];
		}
	}

	return 0;
}